

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  string *this_00;
  MapValueRef *this_local;
  
  switch(this->type_) {
  case 1:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,4);
    }
    break;
  case 2:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,8);
    }
    break;
  case 3:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,4);
    }
    break;
  case 4:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,8);
    }
    break;
  case 5:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,8);
    }
    break;
  case 6:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,4);
    }
    break;
  case 7:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,1);
    }
    break;
  case 8:
    if (this->data_ != (void *)0x0) {
      operator_delete(this->data_,4);
    }
    break;
  case 9:
    this_00 = (string *)this->data_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00,0x20);
    }
    break;
  case 10:
    if ((long *)this->data_ != (long *)0x0) {
      (**(code **)(*this->data_ + 8))();
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        delete reinterpret_cast<TYPE*>(data_);                  \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }